

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t cesu8_to_unicode(uint32_t *pwc,char *s,size_t n)

{
  size_t in_RDX;
  char *in_RSI;
  uint32_t *in_RDI;
  uint32_t wc2;
  wchar_t cnt;
  uint32_t wc;
  uint32_t local_2c;
  wchar_t local_28;
  uint32_t local_24;
  size_t local_20;
  char *local_18;
  uint32_t *local_10;
  
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = _utf8_to_unicode(&local_24,in_RSI,in_RDX);
  if (((local_28 == L'\x03') && (0xd7ff < local_24)) && (local_24 < 0xdc00)) {
    local_2c = 0;
    if (((2 < local_20 - 3) &&
        (local_28 = _utf8_to_unicode(&local_2c,local_18 + 3,local_20 - 3), local_28 == L'\x03')) &&
       ((0xdbff < local_2c && (local_2c < 0xe000)))) {
      local_24 = combine_surrogate_pair(local_24,local_2c);
      local_28 = L'\x06';
LAB_00119d55:
      *local_10 = local_24;
      return local_28;
    }
  }
  else if (((local_28 != L'\x03') || (local_24 < 0xdc00)) || (0xdfff < local_24)) goto LAB_00119d55;
  *local_10 = 0xfffd;
  if (L'\0' < local_28) {
    local_28 = -local_28;
  }
  return local_28;
}

Assistant:

static int
cesu8_to_unicode(uint32_t *pwc, const char *s, size_t n)
{
	uint32_t wc = 0;
	int cnt;

	cnt = _utf8_to_unicode(&wc, s, n);
	if (cnt == 3 && IS_HIGH_SURROGATE_LA(wc)) {
		uint32_t wc2 = 0;
		if (n - 3 < 3) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		cnt = _utf8_to_unicode(&wc2, s+3, n-3);
		if (cnt != 3 || !IS_LOW_SURROGATE_LA(wc2)) {
			/* Invalid byte sequence. */
			goto invalid_sequence;
		}
		wc = combine_surrogate_pair(wc, wc2);
		cnt = 6;
	} else if (cnt == 3 && IS_LOW_SURROGATE_LA(wc)) {
		/* Invalid byte sequence. */
		goto invalid_sequence;
	}
	*pwc = wc;
	return (cnt);
invalid_sequence:
	*pwc = UNICODE_R_CHAR;/* set the Replacement Character instead. */
	if (cnt > 0)
		cnt *= -1;
	return (cnt);
}